

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

PolymorphicEmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitBrIf(WasmBytecodeGenerator *this)

{
  uint uVar1;
  code *pcVar2;
  ulong uVar3;
  WasmBinaryReader *pWVar4;
  EmitInfo EVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uint32 uVar8;
  ulong uVar9;
  PolymorphicEmitInfo *this_00;
  bool bVar10;
  PolymorphicEmitInfo polyExpr;
  PolymorphicEmitInfo PVar11;
  PolymorphicEmitInfo PVar12;
  EmitInfo local_50;
  EmitInfo conditionInfo;
  PolymorphicEmitInfo local_40;
  
  pWVar4 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar4 == (WasmBinaryReader *)0x0) {
    pWVar4 = (this->m_module->m_reader).ptr;
  }
  uVar8 = (pWVar4->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  local_50 = PopEvalStack(this,FirstLocalType,L"br_if condition must have i32 type");
  ReleaseLocation(this,&local_50);
  local_40.count = 0;
  local_40.field_1.infos = (EmitInfo *)0x0;
  EVar5 = (EmitInfo)GetBlockInfo(this,uVar8);
  uVar1 = ((PolymorphicEmitInfo *)((long)EVar5 + 0x10))->count;
  PVar11._4_4_ = 0;
  PVar11.count = uVar1;
  conditionInfo = EVar5;
  if (uVar1 == 0) goto LAB_00f34a10;
  PVar11.field_1.infos =
       ((anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 *)((long)EVar5 + 0x18))->infos;
  PVar11 = PopStackPolymorphic(this,PVar11,(char16 *)0x0);
  local_40.field_1 = PVar11.field_1;
  local_40.count = PVar11.count;
  polyExpr._4_4_ = 0;
  polyExpr.count = local_40.count;
  polyExpr.field_1.infos = local_40.field_1.infos;
  YieldToBlock(this,(BlockInfo *)EVar5,polyExpr);
  uVar8 = local_40.count;
  uVar9 = (ulong)local_40.count;
  if (uVar9 == 0) goto LAB_00f34a10;
  if (local_40.count == 1) {
    bVar10 = local_40.field_1.singleInfo.type == Any;
LAB_00f34913:
    if (!bVar10) goto LAB_00f34a10;
  }
  else {
    bVar10 = uVar9 != 0;
    if (uVar9 == 0) goto LAB_00f34913;
    if ((local_40.field_1.infos)->type != Any) {
      uVar3 = 1;
      do {
        uVar7 = uVar3;
        if (uVar9 == uVar7) break;
        uVar3 = uVar7 + 1;
      } while (local_40.field_1.infos[uVar7].type != Any);
      bVar10 = uVar7 < uVar9;
      goto LAB_00f34913;
    }
  }
  if (this->isUnreachable == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                        ,0x6f0,"(IsUnreachable())","IsUnreachable()");
    if (!bVar10) goto LAB_00f34a45;
    *puVar6 = 0;
  }
  this_00 = (PolymorphicEmitInfo *)((long)conditionInfo + 0x10);
  if (uVar8 != this_00->count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                        ,0x6f1,"(info.Count() == blockInfo->yieldInfo.Count())",
                        "info.Count() == blockInfo->yieldInfo.Count()");
    if (!bVar10) {
LAB_00f34a45:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (local_40.count != 0) {
    uVar8 = 0;
    do {
      EVar5 = PolymorphicEmitInfo::GetInfo(this_00,uVar8);
      PolymorphicEmitInfo::SetInfo(&local_40,(EmitInfo)((ulong)EVar5 | 0xffffffff),uVar8);
      uVar8 = uVar8 + 1;
    } while (uVar8 < local_40.count);
  }
LAB_00f34a10:
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1a])
            (this->m_writer,0x26,(ulong)*(uint *)((long)conditionInfo + 0x24),
             (ulong)local_50 & 0xffffffff);
  PVar12._4_4_ = 0;
  PVar12.count = local_40.count;
  PVar12.field_1.infos = local_40.field_1.infos;
  return PVar12;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitBrIf()
{
    uint32 depth = GetReader()->m_currentNode.br.depth;

    EmitInfo conditionInfo = PopEvalStack(WasmTypes::I32, _u("br_if condition must have i32 type"));
    ReleaseLocation(&conditionInfo);

    PolymorphicEmitInfo info;
    BlockInfo* blockInfo = GetBlockInfo(depth);

    if (blockInfo->HasYield())
    {
        info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        if (info.IsUnreachable())
        {
            Assert(IsUnreachable());
            Assert(info.Count() == blockInfo->yieldInfo.Count());
            // Use the block's yield type to continue type check
            for (uint32 i = 0; i < info.Count(); ++i)
            {
                info.SetInfo(EmitInfo(blockInfo->yieldInfo.GetInfo(i).type), i);
            }
        }
    }

    m_writer->AsmBrReg1(Js::OpCodeAsmJs::BrTrue_Int, blockInfo->label, conditionInfo.location);

    return info;
}